

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_1::InfiniteLoop::setup(InfiniteLoop *this)

{
  ShaderType SVar1;
  Functions *gl;
  GLenum GVar2;
  GLint GVar3;
  ProgramSources *pPVar4;
  ostream *poVar5;
  ostream *poVar6;
  TestError *pTVar7;
  char *pcVar8;
  undefined1 auStack_658 [40];
  undefined1 local_630 [40];
  string loopHeader;
  string iterCount;
  string local_5c8;
  string local_5a8;
  ProgramSources local_588;
  ostringstream vert;
  ostringstream frag;
  string local_338 [368];
  ShaderProgram program;
  ProgramSources local_f8;
  
  gl = (this->super_ContextReset).m_gl;
  SVar1 = (this->super_ContextReset).m_shaderType;
  if (SVar1 == SHADERTYPE_COMPUTE) {
    memset(&vert,0,0xac);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_588,
               "#version 310 es\nlayout(local_size_x = 1, local_size_y = 1) in;\nuniform highp int u_iterCount;\nwriteonly buffer Output { highp int b_output_int; };\nvoid main ()\n{\n\tfor (highp int i = 0; i < u_iterCount || u_iterCount < 0; ++i)\n\t\tb_output_int = u_iterCount;\n}\n"
               ,(allocator<char> *)auStack_658);
    glu::ComputeSource::ComputeSource((ComputeSource *)&frag,(string *)&local_588);
    pPVar4 = glu::ProgramSources::operator<<((ProgramSources *)&vert,(ShaderSource *)&frag);
    glu::ProgramSources::ProgramSources(&local_f8,pPVar4);
    std::__cxx11::string::~string(local_338);
    std::__cxx11::string::~string((string *)&local_588);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&vert);
    goto LAB_00225cd2;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vert);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar5 = std::operator<<((ostream *)&vert,"#version 300 es\n");
  std::operator<<(poVar5,"in highp vec2 a_position;\n");
  std::operator<<((ostream *)&frag,"#version 300 es\n");
  std::operator<<((ostream *)&vert,"uniform highp int u_iterCount;\n");
  if (SVar1 == SHADERTYPE_VERT) {
LAB_002258b9:
    std::operator<<((ostream *)&vert,"out mediump vec4 v_color;\n");
    std::operator<<((ostream *)&frag,"in mediump vec4 v_color;\n");
  }
  else if ((SVar1 == SHADERTYPE_VERT_AND_FRAG) || (SVar1 == SHADERTYPE_FRAG)) {
    std::operator<<((ostream *)&vert,"flat out highp int v_iterCount;\n");
    std::operator<<((ostream *)&frag,"flat in highp int v_iterCount;\n");
    if (SVar1 == SHADERTYPE_VERT_AND_FRAG) goto LAB_002258b9;
  }
  std::operator<<((ostream *)&frag,"out mediump vec4 o_color;\n");
  poVar5 = std::operator<<((ostream *)&vert,"\nvoid main (void)\n{\n");
  poVar5 = std::operator<<(poVar5,"\tgl_Position = vec4(a_position, 0.0, 1.0);\n");
  std::operator<<(poVar5,"\tgl_PointSize = 1.0;\n");
  if ((SVar1 | SHADERTYPE_COMPUTE) == SHADERTYPE_VERT_AND_FRAG) {
    std::operator<<((ostream *)&vert,"\tv_iterCount = u_iterCount;\n");
  }
  std::operator<<((ostream *)&frag,"\nvoid main (void)\n{\n");
  pcVar8 = "v_iterCount";
  if (SVar1 == SHADERTYPE_VERT) {
    pcVar8 = "u_iterCount";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iterCount,pcVar8,(allocator<char> *)&local_588);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630,
                 "\tfor (highp int i = 0; i < ",&iterCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_658,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630,
                 " || ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_588,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_658,
                 &iterCount);
  std::operator+(&loopHeader,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_588,
                 " < 0; ++i)\n");
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)auStack_658);
  std::__cxx11::string::~string((string *)local_630);
  if (SVar1 == SHADERTYPE_VERT_AND_FRAG) {
    poVar5 = std::operator<<((ostream *)&vert,"\tmediump vec4 color = ");
    poVar5 = std::operator<<(poVar5,"a_position.xyxy");
    std::operator<<(poVar5,";\n");
    poVar5 = std::operator<<((ostream *)&vert,(string *)&loopHeader);
    poVar5 = std::operator<<(poVar5,"\t\t");
    poVar5 = std::operator<<(poVar5,"color = cos(sin(color*1.25)*0.8);");
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<((ostream *)&frag,"\tmediump vec4 color = ");
    poVar5 = std::operator<<(poVar5,"gl_FragCoord");
    std::operator<<(poVar5,";\n");
    poVar5 = std::operator<<((ostream *)&frag,(string *)&loopHeader);
    poVar5 = std::operator<<(poVar5,"\t\t");
    poVar5 = std::operator<<(poVar5,"color = cos(sin(color*1.25)*0.8);");
    std::operator<<(poVar5,"\n");
LAB_00225b73:
    std::operator<<((ostream *)&vert,"\tv_color = color;\n");
    pcVar8 = "\to_color = v_color;\n";
  }
  else {
    poVar5 = (ostream *)&frag;
    if (SVar1 == SHADERTYPE_VERT) {
      poVar5 = (ostream *)&vert;
    }
    poVar6 = std::operator<<(poVar5,"\tmediump vec4 color = ");
    pcVar8 = "gl_FragCoord";
    if (SVar1 == SHADERTYPE_VERT) {
      pcVar8 = "a_position.xyxy";
    }
    poVar6 = std::operator<<(poVar6,pcVar8);
    std::operator<<(poVar6,";\n");
    poVar5 = std::operator<<(poVar5,(string *)&loopHeader);
    poVar5 = std::operator<<(poVar5,"\t\t");
    poVar5 = std::operator<<(poVar5,"color = cos(sin(color*1.25)*0.8);");
    std::operator<<(poVar5,"\n");
    if (SVar1 == SHADERTYPE_VERT) goto LAB_00225b73;
    pcVar8 = "\to_color = color;\n";
  }
  std::operator<<((ostream *)&frag,pcVar8);
  std::operator<<((ostream *)&vert,"}\n");
  std::operator<<((ostream *)&frag,"}\n");
  memset(&local_588,0,0xac);
  local_588.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_588.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_588.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_588.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_588._193_8_ = 0;
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)auStack_658,&local_5a8);
  pPVar4 = glu::ProgramSources::operator<<(&local_588,(ShaderSource *)auStack_658);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_630,&local_5c8);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_630);
  glu::ProgramSources::ProgramSources(&local_f8,pPVar4);
  std::__cxx11::string::~string((string *)(local_630 + 8));
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)(auStack_658 + 8));
  std::__cxx11::string::~string((string *)&local_5a8);
  glu::ProgramSources::~ProgramSources(&local_588);
  std::__cxx11::string::~string((string *)&loopHeader);
  std::__cxx11::string::~string((string *)&iterCount);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vert);
LAB_00225cd2:
  glu::ShaderProgram::ShaderProgram(&program,gl,&local_f8);
  glu::ProgramSources::~ProgramSources(&local_f8);
  glu::operator<<((this->super_ContextReset).m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x33b);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_ContextReset).m_gl)->useProgram)(program.m_program.m_program);
  GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar2,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x33d);
  if ((this->super_ContextReset).m_shaderType == SHADERTYPE_COMPUTE) {
    this->m_outputBuffer = 0;
    (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_outputBuffer);
    GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar2,"genBuffers(1, &m_outputBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x343);
    (*((this->super_ContextReset).m_gl)->bindBuffer)(0x90d2,this->m_outputBuffer);
    GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar2,"bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x344);
    (*((this->super_ContextReset).m_gl)->bufferData)(0x90d2,4,(void *)0x0,0x88e8);
    GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar2,
                    "bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(int), DE_NULL, GL_DYNAMIC_DRAW)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x345);
    (*((this->super_ContextReset).m_gl)->bindBufferBase)(0x90d2,0,this->m_outputBuffer);
    GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar2,"bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_outputBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x346);
  }
  else {
    _vert = (pointer)0xbf800000bf800000;
    GVar3 = (*((this->super_ContextReset).m_gl)->getAttribLocation)
                      (program.m_program.m_program,"a_position");
    this->m_coordLocation = GVar3;
    GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar2,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x353);
    if (this->m_coordLocation == -1) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,(char *)0x0,"m_coordLocation != (glw::GLint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                 ,0x354);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this->m_coordinatesBuffer = 0;
    (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_coordinatesBuffer);
    GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar2,"genBuffers(1, &m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x358);
    (*((this->super_ContextReset).m_gl)->bindBuffer)(0x8892,this->m_coordinatesBuffer);
    GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar2,"bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x359);
    (*((this->super_ContextReset).m_gl)->bufferData)(0x8892,0x20,&vert,0x88e4);
    GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar2,
                    "bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x35a);
    (*((this->super_ContextReset).m_gl)->enableVertexAttribArray)(this->m_coordLocation);
    GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar2,"enableVertexAttribArray(m_coordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x35b);
    (*((this->super_ContextReset).m_gl)->vertexAttribPointer)
              (this->m_coordLocation,2,0x1406,'\0',0,(void *)0x0);
    GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar2,"vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x35c);
  }
  GVar3 = (*((this->super_ContextReset).m_gl)->getUniformLocation)
                    (program.m_program.m_program,"u_iterCount");
  GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar2,"glGetUniformLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x360);
  if (GVar3 != -1) {
    (*((this->super_ContextReset).m_gl)->uniform1i)(GVar3,-1);
    GVar2 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar2,"uniform1i(iterCountLocation, iterCount)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x365);
    glu::ShaderProgram::~ShaderProgram(&program);
    return;
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,(char *)0x0,"iterCountLocation != (glw::GLint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
             ,0x361);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InfiniteLoop::setup (void)
{
	glu::ShaderProgram program (m_gl, genSources());
	m_log << program;

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	if (m_shaderType == SHADERTYPE_COMPUTE)
	{
		// Output buffer setup
		m_outputBuffer = 0;
		GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_outputBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(int), DE_NULL, GL_DYNAMIC_DRAW));
		GLU_CHECK_GLW_CALL(m_gl, bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_outputBuffer));
	}
	else
	{
		const glw::GLfloat coords[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			+1.0f, +1.0f,
			-1.0f, +1.0f
		};

		m_coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_position");
		GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
		TCU_CHECK(m_coordLocation != (glw::GLint)-1);

		// Load the vertex data
		m_coordinatesBuffer = 0;
		GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW));
		GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(m_coordLocation));
		GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL));
	}

	glw::GLint iterCountLocation = m_gl.getUniformLocation(program.getProgram(), "u_iterCount");
	GLU_CHECK_GLW_MSG(m_gl, "glGetUniformLocation()");
	TCU_CHECK(iterCountLocation != (glw::GLint)-1);

	// Set the iteration count (infinite)
	glw::GLint iterCount = -1;
	GLU_CHECK_GLW_CALL(m_gl, uniform1i(iterCountLocation, iterCount));
}